

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacReadVer.c
# Opt level: O1

int Psr_ManUtilSkipSpaces(Psr_Man_t *p)

{
  byte *pbVar1;
  byte *pbVar2;
  ulong uVar3;
  
  pbVar1 = (byte *)p->pLimit;
  pbVar2 = (byte *)p->pCur;
  do {
    if (pbVar1 <= pbVar2) {
LAB_003c289d:
      if (p->ErrorStr[0] == '\0') {
        builtin_strncpy(p->ErrorStr,"Unexpectedly reached end-of-file.",0x22);
        return 1;
      }
      __assert_fail("!p->ErrorStr[0]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/bac/bacPrs.h"
                    ,0x9d,"int Psr_ManErrorSet(Psr_Man_t *, char *, int)");
    }
    while( true ) {
      uVar3 = (ulong)*pbVar2;
      if (0x2f < uVar3) {
        return 0;
      }
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) == 0) break;
      pbVar2 = pbVar2 + 1;
      p->pCur = (char *)pbVar2;
    }
    if (uVar3 != 0x2f) {
      if (uVar3 != 0) {
        return 0;
      }
      goto LAB_003c289d;
    }
    if (pbVar2[1] == 0x2a) {
      pbVar2 = pbVar2 + 2;
      p->pCur = (char *)pbVar2;
      if (pbVar1 <= pbVar2) {
        return 0;
      }
      while ((*pbVar2 != 0x2a || (pbVar2[1] != 0x2f))) {
        pbVar2 = pbVar2 + 1;
        p->pCur = (char *)pbVar2;
        if (pbVar2 == pbVar1) {
          return 0;
        }
      }
      pbVar2 = pbVar2 + 2;
    }
    else {
      if (pbVar2[1] != 0x2f) {
        return 0;
      }
      pbVar2 = pbVar2 + 2;
      p->pCur = (char *)pbVar2;
      if (pbVar1 <= pbVar2) {
        return 0;
      }
      while (*pbVar2 != 10) {
        pbVar2 = pbVar2 + 1;
        p->pCur = (char *)pbVar2;
        if (pbVar2 == pbVar1) {
          return 0;
        }
      }
      pbVar2 = pbVar2 + 1;
    }
    p->pCur = (char *)pbVar2;
  } while( true );
}

Assistant:

static inline int Psr_ManUtilSkipSpaces( Psr_Man_t * p )
{
    while ( p->pCur < p->pLimit )
    {
        while ( Psr_CharIsSpace(*p->pCur) ) 
            p->pCur++;
        if ( !*p->pCur )
            return Psr_ManErrorSet(p, "Unexpectedly reached end-of-file.", 1);
        if ( !Psr_ManUtilSkipComments(p) )
            return 0;
    }
    return Psr_ManErrorSet(p, "Unexpectedly reached end-of-file.", 1);
}